

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5TermsetAdd(Fts5Termset *p,int iIdx,char *pTerm,int nTerm,int *pbPresent)

{
  uint uVar1;
  int iVar2;
  Fts5TermsetEntry *pFVar3;
  Fts5TermsetEntry *local_48;
  Fts5TermsetEntry *pEntry;
  int local_38;
  u32 hash;
  int i;
  int rc;
  int *pbPresent_local;
  char *pcStack_20;
  int nTerm_local;
  char *pTerm_local;
  Fts5Termset *pFStack_10;
  int iIdx_local;
  Fts5Termset *p_local;
  
  hash = 0;
  *pbPresent = 0;
  if (p != (Fts5Termset *)0x0) {
    pEntry._4_4_ = 0xd;
    for (local_38 = nTerm + -1; -1 < local_38; local_38 = local_38 + -1) {
      pEntry._4_4_ = pEntry._4_4_ << 3 ^ pEntry._4_4_ ^ (int)pTerm[local_38];
    }
    uVar1 = (pEntry._4_4_ << 3 ^ pEntry._4_4_ ^ iIdx) & 0x1ff;
    _i = pbPresent;
    pbPresent_local._4_4_ = nTerm;
    pcStack_20 = pTerm;
    pTerm_local._4_4_ = iIdx;
    pFStack_10 = p;
    for (local_48 = p->apHash[uVar1]; local_48 != (Fts5TermsetEntry *)0x0;
        local_48 = local_48->pNext) {
      if (((local_48->iIdx == pTerm_local._4_4_) && (local_48->nTerm == pbPresent_local._4_4_)) &&
         (iVar2 = memcmp(local_48->pTerm,pcStack_20,(long)pbPresent_local._4_4_), iVar2 == 0)) {
        *_i = 1;
        break;
      }
    }
    if ((local_48 == (Fts5TermsetEntry *)0x0) &&
       (pFVar3 = (Fts5TermsetEntry *)
                 sqlite3Fts5MallocZero((int *)&hash,(long)pbPresent_local._4_4_ + 0x18),
       pFVar3 != (Fts5TermsetEntry *)0x0)) {
      pFVar3->pTerm = (char *)(pFVar3 + 1);
      pFVar3->nTerm = pbPresent_local._4_4_;
      pFVar3->iIdx = pTerm_local._4_4_;
      memcpy(pFVar3->pTerm,pcStack_20,(long)pbPresent_local._4_4_);
      pFVar3->pNext = pFStack_10->apHash[uVar1];
      pFStack_10->apHash[uVar1] = pFVar3;
    }
  }
  return hash;
}

Assistant:

static int sqlite3Fts5TermsetAdd(
  Fts5Termset *p, 
  int iIdx,
  const char *pTerm, int nTerm, 
  int *pbPresent
){
  int rc = SQLITE_OK;
  *pbPresent = 0;
  if( p ){
    int i;
    u32 hash = 13;
    Fts5TermsetEntry *pEntry;

    /* Calculate a hash value for this term. This is the same hash checksum
    ** used by the fts5_hash.c module. This is not important for correct
    ** operation of the module, but is necessary to ensure that some tests
    ** designed to produce hash table collisions really do work.  */
    for(i=nTerm-1; i>=0; i--){
      hash = (hash << 3) ^ hash ^ pTerm[i];
    }
    hash = (hash << 3) ^ hash ^ iIdx;
    hash = hash % ArraySize(p->apHash);

    for(pEntry=p->apHash[hash]; pEntry; pEntry=pEntry->pNext){
      if( pEntry->iIdx==iIdx 
          && pEntry->nTerm==nTerm 
          && memcmp(pEntry->pTerm, pTerm, nTerm)==0 
      ){
        *pbPresent = 1;
        break;
      }
    }

    if( pEntry==0 ){
      pEntry = sqlite3Fts5MallocZero(&rc, sizeof(Fts5TermsetEntry) + nTerm);
      if( pEntry ){
        pEntry->pTerm = (char*)&pEntry[1];
        pEntry->nTerm = nTerm;
        pEntry->iIdx = iIdx;
        memcpy(pEntry->pTerm, pTerm, nTerm);
        pEntry->pNext = p->apHash[hash];
        p->apHash[hash] = pEntry;
      }
    }
  }

  return rc;
}